

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O1

int av1_quantize_fp_no_qmatrix
              (int16_t *quant_ptr,int16_t *dequant_ptr,int16_t *round_ptr,int log_scale,
              int16_t *scan,int coeff_count,tran_low_t *coeff_ptr,tran_low_t *qcoeff_ptr,
              tran_low_t *dqcoeff_ptr)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  byte bVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  int local_40 [2];
  int16_t *local_38;
  
  iVar5 = 0;
  local_38 = quant_ptr;
  memset(qcoeff_ptr,0,(long)coeff_count * 4);
  memset(dqcoeff_ptr,0,(long)coeff_count * 4);
  bVar4 = (byte)log_scale;
  iVar3 = (1 << (bVar4 & 0x1f)) >> 1;
  local_40[0] = *round_ptr + iVar3 >> (bVar4 & 0x1f);
  local_40[1] = round_ptr[1] + iVar3 >> (bVar4 & 0x1f);
  if (0 < coeff_count) {
    uVar7 = 0;
    uVar11 = 0;
    do {
      lVar8 = (long)scan[uVar7];
      bVar12 = lVar8 != 0;
      iVar3 = coeff_ptr[lVar8];
      iVar5 = -iVar3;
      if (0 < iVar3) {
        iVar5 = iVar3;
      }
      sVar1 = dequant_ptr[bVar12];
      bVar2 = true;
      if ((long)sVar1 <= (long)iVar5 << (bVar4 + 1 & 0x3f)) {
        lVar6 = (long)local_40[bVar12] + (long)iVar5;
        if (0x7ffe < lVar6) {
          lVar6 = 0x7fff;
        }
        if (lVar6 < -0x7fff) {
          lVar6 = -0x8000;
        }
        lVar6 = local_38[bVar12] * lVar6 >> (0x10 - bVar4 & 0x3f);
        if (lVar6 != 0) {
          uVar9 = iVar3 >> 0x1f;
          uVar10 = (uint)lVar6;
          qcoeff_ptr[lVar8] = (uVar9 ^ uVar10) - uVar9;
          dqcoeff_ptr[lVar8] = ((int)((int)sVar1 * uVar10) >> (bVar4 & 0x1f) ^ uVar9) - uVar9;
          bVar2 = false;
        }
      }
      uVar7 = uVar7 + 1;
      if (!bVar2) {
        uVar11 = uVar7 & 0xffffffff;
      }
      iVar5 = (int)uVar11;
    } while ((uint)coeff_count != uVar7);
  }
  return iVar5;
}

Assistant:

int av1_quantize_fp_no_qmatrix(const int16_t quant_ptr[2],
                               const int16_t dequant_ptr[2],
                               const int16_t round_ptr[2], int log_scale,
                               const int16_t *scan, int coeff_count,
                               const tran_low_t *coeff_ptr,
                               tran_low_t *qcoeff_ptr,
                               tran_low_t *dqcoeff_ptr) {
  memset(qcoeff_ptr, 0, coeff_count * sizeof(*qcoeff_ptr));
  memset(dqcoeff_ptr, 0, coeff_count * sizeof(*dqcoeff_ptr));
  const int rounding[2] = { ROUND_POWER_OF_TWO(round_ptr[0], log_scale),
                            ROUND_POWER_OF_TWO(round_ptr[1], log_scale) };
  int eob = 0;
  for (int i = 0; i < coeff_count; i++) {
    const int rc = scan[i];
    const int32_t thresh = (int32_t)(dequant_ptr[rc != 0]);
    const int coeff = coeff_ptr[rc];
    const int coeff_sign = AOMSIGN(coeff);
    int64_t abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
    int tmp32 = 0;
    if ((abs_coeff << (1 + log_scale)) >= thresh) {
      abs_coeff = clamp64(abs_coeff + rounding[rc != 0], INT16_MIN, INT16_MAX);
      tmp32 = (int)((abs_coeff * quant_ptr[rc != 0]) >> (16 - log_scale));
      if (tmp32) {
        qcoeff_ptr[rc] = (tmp32 ^ coeff_sign) - coeff_sign;
        const tran_low_t abs_dqcoeff =
            (tmp32 * dequant_ptr[rc != 0]) >> log_scale;
        dqcoeff_ptr[rc] = (abs_dqcoeff ^ coeff_sign) - coeff_sign;
      }
    }
    if (tmp32) eob = i + 1;
  }
  return eob;
}